

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O1

DataHeader *
offsetTOCLookupFn(UDataMemory *pData,char *tocEntryName,int32_t *pLength,UErrorCode *pErrorCode)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  DataHeader *pDVar8;
  ulong unaff_RBX;
  int32_t iVar9;
  int iVar10;
  uint uVar11;
  int32_t pl_1;
  int iVar12;
  long lVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  int32_t pl_2;
  int iVar17;
  
  piVar6 = (int *)pData->toc;
  if (piVar6 == (int *)0x0) {
    return pData->pHeader;
  }
  iVar5 = *piVar6;
  if ((long)iVar5 == 0) {
LAB_002ea4af:
    uVar15 = 0xffffffff;
  }
  else {
    lVar13 = 0;
    iVar10 = 0;
    do {
      cVar1 = tocEntryName[lVar13];
      cVar2 = *(char *)((long)piVar6 + lVar13 + (ulong)(uint)piVar6[1]);
      unaff_RBX = CONCAT71((int7)(unaff_RBX >> 8),cVar2);
      bVar14 = cVar1 != '\0' && cVar1 == cVar2;
      iVar10 = iVar10 + (uint)bVar14;
      lVar13 = lVar13 + 1;
    } while (bVar14);
    uVar15 = 0;
    if (cVar1 != cVar2) {
      uVar11 = iVar5 - 1;
      lVar13 = 0;
      iVar12 = 0;
      do {
        cVar1 = tocEntryName[lVar13];
        unaff_RBX = CONCAT71((int7)(unaff_RBX >> 8),cVar1);
        cVar2 = *(char *)((long)piVar6 + lVar13 + (ulong)(uint)piVar6[(long)iVar5 * 2 + -1]);
        bVar14 = cVar1 != '\0' && cVar1 == cVar2;
        iVar12 = iVar12 + (uint)bVar14;
        lVar13 = lVar13 + 1;
      } while (bVar14);
      uVar15 = uVar11;
      if (cVar1 != cVar2) {
        iVar16 = 1;
        do {
          if ((int)uVar11 <= iVar16) goto LAB_002ea4af;
          uVar15 = iVar16 + uVar11 >> 1;
          iVar17 = iVar12;
          if (iVar10 < iVar12) {
            iVar17 = iVar10;
          }
          lVar13 = (long)iVar17;
          do {
            bVar3 = tocEntryName[lVar13];
            bVar4 = *(byte *)((long)piVar6 + lVar13 + (ulong)(uint)piVar6[(ulong)uVar15 * 2 + 1]);
            bVar14 = bVar3 != 0 && bVar3 == bVar4;
            iVar17 = iVar17 + (uint)bVar14;
            lVar13 = lVar13 + 1;
          } while (bVar14);
          bVar14 = true;
          if (bVar3 < bVar4) {
LAB_002ea4a2:
            unaff_RBX = unaff_RBX & 0xffffffff;
            uVar11 = uVar15;
            iVar12 = iVar17;
          }
          else {
            if (bVar3 != bVar4) {
              iVar16 = uVar15 + 1;
              iVar10 = iVar17;
              uVar15 = uVar11;
              iVar17 = iVar12;
              goto LAB_002ea4a2;
            }
            bVar14 = false;
            unaff_RBX = (ulong)uVar15;
          }
          uVar15 = (uint)unaff_RBX;
        } while (bVar14);
      }
    }
  }
  if ((int)uVar15 < 0) {
    pDVar8 = (DataHeader *)0x0;
  }
  else {
    uVar7 = (ulong)uVar15;
    iVar9 = -1;
    if ((int)(uVar15 + 1) < iVar5) {
      iVar9 = piVar6[uVar7 * 2 + 4] - piVar6[uVar7 * 2 + 2];
    }
    *pLength = iVar9;
    pDVar8 = (DataHeader *)((ulong)(uint)piVar6[uVar7 * 2 + 2] + (long)piVar6);
  }
  return pDVar8;
}

Assistant:

static const DataHeader * U_CALLCONV
offsetTOCLookupFn(const UDataMemory *pData,
                  const char *tocEntryName,
                  int32_t *pLength,
                  UErrorCode *pErrorCode) {
    (void)pErrorCode;
    const UDataOffsetTOC  *toc = (UDataOffsetTOC *)pData->toc;
    if(toc!=NULL) {
        const char *base=(const char *)toc;
        int32_t number, count=(int32_t)toc->count;

        /* perform a binary search for the data in the common data's table of contents */
#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, &base[toc->entry[number].nameOffset]);
        }
#endif
        number=offsetTOCPrefixBinarySearch(tocEntryName, base, toc->entry, count);
        if(number>=0) {
            /* found it */
            const UDataOffsetTOCEntry *entry=toc->entry+number;
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", tocEntryName);
#endif
            if((number+1) < count) {
                *pLength = (int32_t)(entry[1].dataOffset - entry->dataOffset);
            } else {
                *pLength = -1;
            }
            return (const DataHeader *)(base+entry->dataOffset);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", tocEntryName);
#endif
            return NULL;
        }
    } else {
#ifdef UDATA_DEBUG
        fprintf(stderr, "returning header\n");
#endif

        return pData->pHeader;
    }
}